

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O0

DdNode * Cudd_SupersetShortPaths(DdManager *dd,DdNode *f,int numVars,int threshold,int hardlimit)

{
  DdNode *pDVar1;
  DdNode *g;
  DdNode *subset;
  int hardlimit_local;
  int threshold_local;
  int numVars_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  memOut = 0;
  do {
    dd->reordered = 0;
    pDVar1 = cuddSubsetShortPaths(dd,(DdNode *)((ulong)f ^ 1),numVars,threshold,hardlimit);
  } while (dd->reordered == 1 && memOut == 0);
  return (DdNode *)((ulong)pDVar1 ^ (long)(int)(uint)(pDVar1 != (DdNode *)0x0));
}

Assistant:

DdNode *
Cudd_SupersetShortPaths(
  DdManager * dd /* manager */,
  DdNode * f /* function to be superset */,
  int  numVars /* number of variables in the support of f */,
  int  threshold /* maximum number of nodes in the subset */,
  int  hardlimit /* flag: 1 if threshold is a hard limit */)
{
    DdNode *subset, *g;

    g = Cudd_Not(f);
    memOut = 0;
    do {
        dd->reordered = 0;
        subset = cuddSubsetShortPaths(dd, g, numVars, threshold, hardlimit);
    } while((dd->reordered ==1) && (!memOut));

    return(Cudd_NotCond(subset, (subset != NULL)));

}